

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

void __thiscall QByteArrayMatcher::setPattern(QByteArrayMatcher *this,QByteArray *pattern)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  
  QByteArray::operator=(&this->q_pattern,pattern);
  pcVar3 = (pattern->d).ptr;
  if ((uchar *)pcVar3 == (uchar *)0x0) {
    pcVar3 = &QByteArray::_empty;
  }
  (this->field_2).p.p = (uchar *)pcVar3;
  uVar1 = (pattern->d).size;
  (this->field_2).p.l = uVar1;
  uVar5 = 0xff;
  if (uVar1 < 0xff) {
    uVar5 = uVar1;
  }
  memset(&this->field_2,(int)uVar5,0x100);
  if (uVar1 != 0) {
    cVar4 = (char)uVar5;
    lVar2 = 0;
    do {
      cVar4 = cVar4 + -1;
      *(char *)((long)&this->field_2 + (ulong)((uchar *)pcVar3)[lVar2 + (uVar1 - uVar5)]) = cVar4;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != (int)uVar5);
  }
  return;
}

Assistant:

void QByteArrayMatcher::setPattern(const QByteArray &pattern)
{
    q_pattern = pattern;
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}